

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
* __thiscall
pstore::serialize::
read<std::pair<std::__cxx11::string,pstore::extent<char>>,pstore::serialize::archive::database_reader>
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
           *__return_storage_ptr__,serialize *this,database_reader *archive)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  span<unsigned_char,__1L> sp;
  extent_type<_1L> unaff_RBX;
  pointer unaff_R14;
  value_type local_48;
  value_type local_28;
  
  sp.storage_.data_ = unaff_R14;
  sp.storage_.super_extent_type<_1L>.size_ = unaff_RBX.size_;
  flood<_1l>(sp);
  serializer<std::__cxx11::string,void>::read<pstore::serialize::archive::database_reader&>
            ((database_reader *)this,&local_48);
  serializer<pstore::extent<char>,void>::read<pstore::serialize::archive::database_reader&>
            ((database_reader *)this,&local_28);
  paVar1 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == &local_48.field_2) {
    paVar1->_M_allocated_capacity = local_48.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_48.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = local_48._M_dataplus._M_p;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity =
         local_48.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->first)._M_string_length = local_48._M_string_length;
  (__return_storage_ptr__->second).addr.a_.a_ = (value_type)local_28.addr.a_.a_;
  (__return_storage_ptr__->second).size = local_28.size;
  return __return_storage_ptr__;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }